

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

void __thiscall Highs::appendBasicRowsToBasisInterface(Highs *this,HighsInt ext_num_new_row)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *this_00;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  int in_ESI;
  long in_RDI;
  HighsInt iRow_1;
  HighsInt newNumTot;
  HighsInt iRow;
  HighsInt newNumRow;
  HighsLp *lp;
  SimplexBasis *simplex_basis;
  bool has_simplex_basis;
  HighsBasis *highs_basis;
  int local_40;
  undefined4 in_stack_ffffffffffffffc8;
  
  if ((in_ESI != 0) && ((*(byte *)(in_RDI + 0x72) & 1) != 0)) {
    bVar1 = *(byte *)(in_RDI + 0x384c);
    this_00 = (vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)(in_RDI + 0x138);
    iVar2 = *(int *)(in_RDI + 0x13c) + in_ESI;
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (this_00,CONCAT44(iVar2,in_stack_ffffffffffffffc8));
    for (iVar3 = *(int *)((long)&(this_00->
                                 super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 4); iVar3 < iVar2;
        iVar3 = iVar3 + 1) {
      pvVar4 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (in_RDI + 0xb8),(long)iVar3);
      *pvVar4 = kBasic;
    }
    if ((bVar1 & 1) != 0) {
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                ((vector<signed_char,_std::allocator<signed_char>_> *)this_00,CONCAT44(iVar2,iVar3))
      ;
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                ((vector<signed_char,_std::allocator<signed_char>_> *)this_00,CONCAT44(iVar2,iVar3))
      ;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)this_00,CONCAT44(iVar2,iVar3));
      for (local_40 = *(int *)((long)&(this_00->
                                      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 4);
          local_40 < iVar2; local_40 = local_40 + 1) {
        pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x3c88),
                            (long)(*(int *)&(this_00->
                                            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                                            )._M_impl.super__Vector_impl_data._M_start + local_40));
        *pvVar5 = '\0';
        pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x3ca0),
                            (long)(*(int *)&(this_00->
                                            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                                            )._M_impl.super__Vector_impl_data._M_start + local_40));
        *pvVar5 = '\0';
        iVar3 = *(int *)&(this_00->
                         super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>).
                         _M_impl.super__Vector_impl_data._M_start;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3c70),(long)local_40);
        *pvVar6 = iVar3 + local_40;
      }
    }
  }
  return;
}

Assistant:

void Highs::appendBasicRowsToBasisInterface(const HighsInt ext_num_new_row) {
  if (ext_num_new_row == 0) return;
  HighsBasis& highs_basis = basis_;
  if (!highs_basis.useful) return;
  const bool has_simplex_basis = ekk_instance_.status_.has_basis;
  SimplexBasis& simplex_basis = ekk_instance_.basis_;
  HighsLp& lp = model_.lp_;

  assert(highs_basis.col_status.size() == static_cast<size_t>(lp.num_col_));
  assert(highs_basis.row_status.size() == static_cast<size_t>(lp.num_row_));

  // Add basic logicals
  // Add the new rows to the Highs basis
  HighsInt newNumRow = lp.num_row_ + ext_num_new_row;
  highs_basis.row_status.resize(newNumRow);
  for (HighsInt iRow = lp.num_row_; iRow < newNumRow; iRow++)
    highs_basis.row_status[iRow] = HighsBasisStatus::kBasic;
  if (has_simplex_basis) {
    // Add the new rows to the simplex basis
    HighsInt newNumTot = lp.num_col_ + newNumRow;
    simplex_basis.nonbasicFlag_.resize(newNumTot);
    simplex_basis.nonbasicMove_.resize(newNumTot);
    simplex_basis.basicIndex_.resize(newNumRow);
    for (HighsInt iRow = lp.num_row_; iRow < newNumRow; iRow++) {
      simplex_basis.nonbasicFlag_[lp.num_col_ + iRow] = kNonbasicFlagFalse;
      simplex_basis.nonbasicMove_[lp.num_col_ + iRow] = 0;
      simplex_basis.basicIndex_[iRow] = lp.num_col_ + iRow;
    }
  }
}